

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

int * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::get_payload
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  longlong *plVar1;
  int iVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  self_type **ppsVar8;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  undefined1 auVar9 [16];
  undefined8 in_XMM0_Qa;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  plVar1 = &(this->stats_).num_lookups;
  *plVar1 = *plVar1 + 1;
  this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)this->root_node_;
  if ((this_00->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar2 = *key;
    auVar12._0_8_ = (double)iVar2;
    auVar12._8_8_ = in_XMM0_Qa;
    do {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (this_00->super_AlexNode<int,_int>).model_.a_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (this_00->super_AlexNode<int,_int>).model_.b_;
      auVar9 = vfmadd213sd_fma(auVar11,auVar12,auVar9);
      uVar7 = *(int *)&this_00->allocator_ - 1;
      dVar10 = auVar9._0_8_;
      uVar4 = ~((int)dVar10 >> 0x1f) & (int)dVar10;
      if ((int)uVar4 <= (int)uVar7) {
        uVar7 = uVar4;
      }
      this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(this_00->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar7];
    } while ((this_00->super_AlexNode<int,_int>).is_leaf_ != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)(this_00->super_AlexNode<int,_int>).level_;
    auVar12 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar10 + 0.5)));
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar10 - auVar12._0_8_;
    auVar9 = vandpd_avx512vl(auVar13,auVar3);
    if (auVar9._0_8_ <= dVar10 * 2.220446049250313e-15) {
      if (auVar12._0_8_ <= dVar10) {
        if (this_00->prev_leaf_ ==
            (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)0x0) goto LAB_00134af3;
        iVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                ::last_key(this_00->prev_leaf_);
        if (iVar5 < iVar2) goto LAB_00134af3;
        ppsVar8 = &this_00->prev_leaf_;
      }
      else {
        if (this_00->next_leaf_ ==
            (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)0x0) goto LAB_00134af3;
        iVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                ::first_key(this_00->next_leaf_);
        if (iVar2 < iVar5) goto LAB_00134af3;
        ppsVar8 = &this_00->next_leaf_;
      }
      this_00 = *ppsVar8;
    }
  }
LAB_00134af3:
  uVar7 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          find_key(this_00,key);
  if ((int)uVar7 < 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = this_00->payload_slots_ + uVar7;
  }
  return piVar6;
}

Assistant:

P* get_payload(const T& key) const {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_key(key);
    if (idx < 0) {
      return nullptr;
    } else {
      return &(leaf->get_payload(idx));
    }
  }